

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * __thiscall
ON_ManagedFonts::GetFromSerialNumber(ON_ManagedFonts *this,uint managed_font_serial_number)

{
  uint uVar1;
  uint uVar2;
  ON_Font **base;
  ON_ManagedFonts *local_48;
  uint font_count;
  ON_Font **managed_fonts;
  uint managed_font_serial_number_local;
  ON_ManagedFonts *this_local;
  
  uVar1 = ON_FontList::Count(&this->m_managed_fonts);
  if (uVar1 == 0) {
    Internal_AddManagedFont(this,&ON_Font::Default,(ON_FontMetrics *)0x0);
  }
  if (managed_font_serial_number == 0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
               ,0x341,"","managed_font_serial_number parameter must be >= 1");
    this_local = (ON_ManagedFonts *)0x0;
  }
  else {
    uVar1 = ON_Font::RuntimeSerialNumber(&ON_Font::Default);
    if (managed_font_serial_number == uVar1) {
      this_local = (ON_ManagedFonts *)&ON_Font::Default;
    }
    else {
      base = ON_SimpleArray<const_ON_Font_*>::Array(&(this->m_managed_fonts).m_by_index);
      uVar1 = ON_SimpleArray<const_ON_Font_*>::UnsignedCount(&(this->m_managed_fonts).m_by_index);
      if ((managed_font_serial_number <= uVar1) &&
         (uVar2 = ON_Font::RuntimeSerialNumber(base[managed_font_serial_number - 1]),
         managed_font_serial_number == uVar2)) {
        return base[managed_font_serial_number - 1];
      }
      if (uVar1 == 0) {
        local_48 = (ON_ManagedFonts *)0x0;
      }
      else {
        local_48 = (ON_ManagedFonts *)
                   Internal_BinarySearchForManagedFontSerialNumber
                             (managed_font_serial_number,base,(ulong)uVar1);
      }
      this_local = local_48;
    }
  }
  return (ON_Font *)this_local;
}

Assistant:

const ON_Font* ON_ManagedFonts::GetFromSerialNumber(
  unsigned int managed_font_serial_number
  )
{
  if (0 == m_managed_fonts.Count())
  {
    // Put ON_Font::Default as the first entry in this list.
    Internal_AddManagedFont(&ON_Font::Default, nullptr);
  }
  if (managed_font_serial_number < 1)
  {
    ON_ERROR("managed_font_serial_number parameter must be >= 1");
    return nullptr;
  }

  if ( managed_font_serial_number == ON_Font::Default.RuntimeSerialNumber() )
    return &ON_Font::Default;

  const ON_Font* const * managed_fonts = m_managed_fonts.m_by_index.Array();
  const unsigned int font_count = m_managed_fonts.m_by_index.UnsignedCount();

  if (managed_font_serial_number <= font_count
    && managed_font_serial_number == managed_fonts[managed_font_serial_number - 1]->RuntimeSerialNumber())
  {
    // This test should always find the managed font as long as the current numbering scheme is used.
    return managed_fonts[managed_font_serial_number - 1];
  }
  
  return
    (font_count > 0)
    ? Internal_BinarySearchForManagedFontSerialNumber(managed_font_serial_number, managed_fonts, font_count)
    : nullptr;
}